

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O1

void __thiscall
rank::Rank::Rank(Rank *this,vector<rank::KeyValue,_std::allocator<rank::KeyValue>_> *key_values)

{
  pointer *ppEVar1;
  pointer pKVar2;
  iterator __position;
  KeyValue *kv;
  pointer pKVar3;
  Entry local_48;
  
  (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_dirty = true;
  std::vector<rank::Entry,_std::allocator<rank::Entry>_>::reserve
            (&this->_entries,
             (long)(key_values->super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(key_values->super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pKVar3 = (key_values->super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pKVar2 = (key_values->super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (pKVar3 != pKVar2) {
    do {
      local_48._key_value._key = pKVar3->_key;
      local_48._key_value._value = pKVar3->_value;
      local_48._order = 0;
      __position._M_current =
           (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<rank::Entry,_std::allocator<rank::Entry>_>::_M_realloc_insert<rank::Entry>
                  (&this->_entries,__position,&local_48);
      }
      else {
        (__position._M_current)->_order = 0;
        ((__position._M_current)->_key_value)._key = local_48._key_value._key;
        ((__position._M_current)->_key_value)._value = local_48._key_value._value;
        ppEVar1 = &(this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar2);
  }
  return;
}

Assistant:

Rank::Rank(const std::vector<KeyValue>& key_values) {
        _dirty = true;
        _entries.reserve(key_values.size());
        for (auto &kv: key_values) { _entries.push_back(kv); }
    }